

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
cs_impl::
try_convert_and_check<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
::convert(var *val)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_00000318;
  string *in_stack_fffffffffffffeb8;
  any *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  
  this_00 = in_RDI;
  any::type(in_stack_fffffffffffffec0);
  bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)in_RDI);
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffef8);
    std::operator+((char *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::operator+(in_RDI,(char *)this);
    get_name_of_type<std::__cxx11::string>();
    cxx_demangle_abi_cxx11_(in_stack_00000318);
    std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::operator+(in_RDI,(char *)this);
    any::get_type_name_abi_cxx11_((any *)in_RDI);
    std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    cs::runtime_error::runtime_error(this,in_stack_fffffffffffffeb8);
    __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  pbVar2 = convert_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_val((any *)0x302ec3);
  std::__cxx11::string::string((string *)in_RDI,(string *)pbVar2);
  return this_00;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", provided " +
				                        val.get_type_name());
		}